

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void pbrt::LogFatal(LogLevel level,char *file,int line,char *s)

{
  uint uVar1;
  FILE *__stream;
  uint uVar2;
  uint *puVar3;
  LogLevel level_00;
  undefined4 in_register_00000014;
  undefined8 local_70 [4];
  string local_50;
  
  std::mutex::lock(&LogFatal::mutex);
  __stream = _stderr;
  uVar2 = getpid();
  puVar3 = (uint *)ThreadIndex();
  uVar1 = *puVar3;
  (anonymous_namespace)::TimeNow_abi_cxx11_();
  ToString_abi_cxx11_(&local_50,(pbrt *)(ulong)level,level_00);
  fprintf(__stream,"[ %d.%03d %s %s:%d ] %s %s\n",(ulong)uVar2,(ulong)uVar1,local_70[0],file,
          CONCAT44(in_register_00000014,line),local_50._M_dataplus._M_p,s);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)local_70);
  CheckCallbackScope::Fail();
  abort();
}

Assistant:

void LogFatal(LogLevel level, const char *file, int line, const char *s) {
#ifdef PBRT_IS_GPU_CODE
    Log(LogLevel::Fatal, file, line, s);
    __threadfence();
    asm("trap;");
#else
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock(mutex);

    fprintf(stderr, "[ " LOG_BASE_FMT " %s:%d ] %s %s\n", LOG_BASE_ARGS, file, line,
            ToString(level).c_str(), s);

    CheckCallbackScope::Fail();
    abort();
#endif
}